

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_putbit.c
# Opt level: O1

MPP_RET vp8e_set_buffer(Vp8ePutBitBuf *bitbuf,RK_U8 *data,RK_S32 size)

{
  MPP_RET MVar1;
  
  MVar1 = MPP_NOK;
  if (0 < size && (data != (RK_U8 *)0x0 && bitbuf != (Vp8ePutBitBuf *)0x0)) {
    bitbuf->data = data;
    bitbuf->p_data = data;
    bitbuf->size = size;
    bitbuf->byte_cnt = 0;
    bitbuf->range = 0xff;
    bitbuf->bottom = 0;
    bitbuf->bits_left = 0x18;
    MVar1 = MPP_OK;
  }
  return MVar1;
}

Assistant:

MPP_RET vp8e_set_buffer(Vp8ePutBitBuf *bitbuf, RK_U8 *data, RK_S32 size)
{
    if ((bitbuf == NULL) || (data == NULL) || (size < 1))
        return MPP_NOK;

    bitbuf->data = data;
    bitbuf->p_data = data;
    bitbuf->size = size;

    bitbuf->range = 255;
    bitbuf->bottom = 0;
    bitbuf->bits_left = 24;

    bitbuf->byte_cnt = 0;

    return MPP_OK;
}